

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

void __thiscall
Minisat::
OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
::clean(OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
        *this,Lit *idx)

{
  vec<Minisat::Solver::Watcher,_int> *this_00;
  vec<Minisat::Solver::Watcher,_int> *pvVar1;
  bool bVar2;
  long lVar3;
  char *__function;
  long lVar4;
  Size nelems;
  long lVar5;
  int iVar6;
  
  iVar6 = idx->x;
  if (iVar6 < (this->occs).map.sz) {
    pvVar1 = (this->occs).map.data;
    this_00 = pvVar1 + iVar6;
    if (pvVar1[iVar6].sz < 1) {
      nelems = 0;
    }
    else {
      lVar4 = 0;
      lVar5 = 0;
      iVar6 = 0;
      do {
        bVar2 = Solver::WatcherDeleted::operator()
                          (&this->deleted,(Watcher *)((long)&this_00->data->cref + lVar4));
        if (!bVar2) {
          lVar3 = (long)iVar6;
          iVar6 = iVar6 + 1;
          this_00->data[lVar3] = *(Watcher *)((long)&this_00->data->cref + lVar4);
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 8;
      } while (lVar5 < this_00->sz);
      nelems = (int)lVar5 - iVar6;
    }
    vec<Minisat::Solver::Watcher,_int>::shrink(this_00,nelems);
    if (idx->x < (this->dirty).map.sz) {
      (this->dirty).map.data[idx->x] = '\0';
      return;
    }
    __function = 
    "V &Minisat::IntMap<Minisat::Lit, char, Minisat::MkIndexLit>::operator[](K) [K = Minisat::Lit, V = char, MkIndex = Minisat::MkIndexLit]"
    ;
  }
  else {
    __function = 
    "V &Minisat::IntMap<Minisat::Lit, Minisat::vec<Minisat::Solver::Watcher>, Minisat::MkIndexLit>::operator[](K) [K = Minisat::Lit, V = Minisat::vec<Minisat::Solver::Watcher>, MkIndex = Minisat::MkIndexLit]"
    ;
  }
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/IntMap.h"
                ,0x28,__function);
}

Assistant:

void OccLists<K,Vec,Deleted,MkIndex>::clean(const K& idx)
{
    Vec& vec = occs[idx];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[idx] = 0;
}